

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::finalize(CommonCore *this,LocalFederateId federateID)

{
  FederateStates FVar1;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  string_view message;
  ActionMessage bye;
  
  this_00 = getFederateAt(this,federateID);
  if (this_00 == (FederateState *)0x0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message._M_str = "federateID not valid finalize";
    message._M_len = 0x1d;
    InvalidIdentifier::InvalidIdentifier(this_01,message);
    __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  if ((BrokerState)((this->super_BrokerBase).brokerState._M_i & CONNECTING) == TERMINATING) {
    ActionMessage::ActionMessage(&bye,cmd_stop);
    bye.source_id.gid = (this_00->global_id)._M_i.gid;
    bye.dest_id.gid = bye.source_id.gid;
    BrokerBase::addActionMessage(&this->super_BrokerBase,&bye);
    FederateState::addAction(this_00,&bye);
  }
  else {
    ActionMessage::ActionMessage(&bye,cmd_disconnect);
    bye.source_id.gid = (this_00->global_id)._M_i.gid;
    bye.dest_id.gid = bye.source_id.gid;
    BrokerBase::addActionMessage(&this->super_BrokerBase,&bye);
  }
  ActionMessage::~ActionMessage(&bye);
  if ((this_00->mCallbackBased == true) &&
     (FVar1 = FederateState::getState(this_00), FVar1 != CREATED)) {
    return;
  }
  FederateState::finalize(this_00);
  return;
}

Assistant:

void CommonCore::finalize(LocalFederateId federateID)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid finalize"));
    }

    auto cbrokerState = getBrokerState();
    switch (cbrokerState) {
        case BrokerState::TERMINATED:
        case BrokerState::TERMINATING:
        case BrokerState::TERMINATING_ERROR:
        case BrokerState::ERRORED: {
            ActionMessage bye(CMD_STOP);
            bye.source_id = fed->global_id.load();
            bye.dest_id = bye.source_id;
            addActionMessage(bye);
            fed->addAction(bye);
        } break;
        default: {
            ActionMessage bye(CMD_DISCONNECT);
            bye.source_id = fed->global_id.load();
            bye.dest_id = bye.source_id;
            addActionMessage(bye);
        } break;
    }
    if (fed->isCallbackFederate()) {
        if (fed->getState() == FederateStates::CREATED) {
            fed->finalize();
        }
        // else just let the normal callback operation take place
    } else {
        fed->finalize();
    }
}